

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

union_tag * get_tag(int braces)

{
  int lineno;
  int iVar1;
  char *line;
  char *cptr;
  ushort **ppuVar2;
  union_tag *puVar3;
  bool bVar4;
  char *t_cptr;
  char *t_line;
  int local_10;
  int t_lineno;
  int c;
  int braces_local;
  
  local_10 = (int)*::cptr;
  lineno = input_file->lineno;
  line = dup_line();
  cptr = line + ((long)::cptr - (long)::line);
  if (braces != 0) {
    if (local_10 != 0x3c) {
      illegal_tag(lineno,line,cptr);
    }
    ::cptr = ::cptr + 1;
    local_10 = nextc();
    if (local_10 == -1) {
      unexpected_EOF();
    }
  }
  ppuVar2 = __ctype_b_loc();
  if (((((*ppuVar2)[local_10] & 0x400) == 0) && (local_10 != 0x5f)) && (local_10 != 0x24)) {
    illegal_tag(lineno,line,cptr);
  }
  cinc = 0;
  do {
    cachec(local_10);
    local_10 = (int)::cptr[1];
    ::cptr = ::cptr + 1;
    ppuVar2 = __ctype_b_loc();
    bVar4 = true;
    if (((((*ppuVar2)[local_10] & 8) == 0) && (bVar4 = true, local_10 != 0x5f)) &&
       (bVar4 = true, local_10 != 0x2e)) {
      bVar4 = local_10 == 0x24;
    }
  } while (bVar4);
  if (braces != 0) {
    iVar1 = nextc();
    if (iVar1 == -1) {
      unexpected_EOF();
    }
    if (iVar1 != 0x3e) {
      illegal_tag(lineno,line,cptr);
    }
    ::cptr = ::cptr + 1;
  }
  free(line);
  havetags = 1;
  puVar3 = cache_tag(cache,cinc);
  return puVar3;
}

Assistant:

union_tag *get_tag(int braces)
{
    register int c = *cptr;
    int t_lineno = input_file->lineno;
    char *t_line = dup_line();
    char *t_cptr = t_line + (cptr - line);

    if (braces) {
	if (c != '<')
	    illegal_tag(t_lineno, t_line, t_cptr);
	++cptr;
	c = nextc();
	if (c == EOF) unexpected_EOF(); }
    if (!isalpha(c) && c != '_' && c != '$')
	illegal_tag(t_lineno, t_line, t_cptr);
    cinc = 0;
    do { cachec(c); c = *++cptr; } while (IS_IDENT(c));
    if (braces) {
	c = nextc();
	if (c == EOF) unexpected_EOF();
	if (c != '>')
	    illegal_tag(t_lineno, t_line, t_cptr);
	++cptr; }
    FREE(t_line);
    havetags = 1;
    return cache_tag(cache, cinc);
}